

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmValue __thiscall cmMakefile::GetProperty(cmMakefile *this,string *prop)

{
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  string *psVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  cmStateDirectory local_48;
  
  if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
    if (iVar2 != 0) {
      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
    }
  }
  __x._M_str = (prop->_M_dataplus)._M_p;
  __x._M_len = prop->_M_string_length;
  __y._M_str = "TESTS";
  __y._M_len = 5;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (p_Var3 = (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->Tests)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::__cxx11::string::string((string *)&local_48,(string *)(p_Var3 + 1));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&keys,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    cmList::
    to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              ((string *)&local_48,&keys);
    psVar4 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
    std::__cxx11::string::operator=
              ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
               (string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&keys);
  }
  else {
    cmStateSnapshot::GetDirectory(&local_48,&this->StateSnapshot);
    psVar4 = (string *)cmStateDirectory::GetProperty(&local_48,prop);
  }
  return (cmValue)psVar4;
}

Assistant:

cmValue cmMakefile::GetProperty(const std::string& prop) const
{
  // Check for computed properties.
  static std::string output;
  if (prop == "TESTS"_s) {
    std::vector<std::string> keys;
    // get list of keys
    const auto* t = this;
    std::transform(
      t->Tests.begin(), t->Tests.end(), std::back_inserter(keys),
      [](decltype(t->Tests)::value_type const& pair) { return pair.first; });
    output = cmList::to_string(keys);
    return cmValue(output);
  }

  return this->StateSnapshot.GetDirectory().GetProperty(prop);
}